

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O3

void __thiscall Clasp::Cli::ClaspAppBase::setup(ClaspAppBase *this)

{
  EventHandler *this_00;
  int iVar1;
  Verbosity VVar2;
  ClaspFacade *this_01;
  undefined4 extraout_var;
  ulong uVar3;
  LemmaLogger *this_02;
  ulong uVar4;
  Verbosity verb;
  ClaspFacade *pCVar5;
  long *plVar6;
  allocator local_41;
  string local_40;
  
  (*(this->super_Application)._vptr_Application[0x15])();
  this_01 = (ClaspFacade *)operator_new(0x1a8);
  ClaspFacade::ClaspFacade(this_01);
  uVar3 = (this->clasp_).ptr_;
  pCVar5 = (ClaspFacade *)(uVar3 & 0xfffffffffffffffe);
  if (((uVar3 & 1) != 0 && this_01 != pCVar5) &&
     ((this->clasp_).ptr_ = (uintp)pCVar5, pCVar5 != (ClaspFacade *)0x0)) {
    (*(pCVar5->super_ModelHandler)._vptr_ModelHandler[1])();
  }
  (this->clasp_).ptr_ = (ulong)this_01 | 1;
  if ((this->claspAppOpts_).onlyPre == '\0') {
    iVar1 = (*(this->super_Application)._vptr_Application[0x18])(this);
    uVar3 = (this->out_).ptr_;
    if ((((uVar3 & 1) != 0) &&
        (plVar6 = (long *)(uVar3 & 0xfffffffffffffffe),
        (long *)CONCAT44(extraout_var,iVar1) != plVar6)) &&
       ((this->out_).ptr_ = (uintp)plVar6, plVar6 != (long *)0x0)) {
      (**(code **)(*plVar6 + 8))();
    }
    (this->out_).ptr_ = CONCAT44(extraout_var,iVar1) | 1;
    VVar2 = Potassco::Application::verbose(&this->super_Application);
    verb = verbosity_max;
    if (VVar2 < verbosity_max) {
      verb = VVar2;
    }
    uVar3 = (this->out_).ptr_ & 0xfffffffffffffffe;
    if ((uVar3 != 0) && (VVar2 = *(Verbosity *)(uVar3 + 0x28), VVar2 < verb)) {
      verb = VVar2;
    }
    if ((this->claspAppOpts_).lemmaLog._M_string_length != 0) {
      this_02 = (LemmaLogger *)operator_new(0x40);
      std::__cxx11::string::string
                ((string *)&local_40,(this->claspAppOpts_).lemmaLog._M_dataplus._M_p,&local_41);
      LemmaLogger::LemmaLogger(this_02,&local_40,&(this->claspAppOpts_).lemma);
      SingleOwnerPtr<Clasp::Cli::LemmaLogger,_Clasp::DeleteObject>::reset(&this->logger_,this_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
    }
    this_00 = &this->super_EventHandler;
    EventHandler::setVerbosity(this_00,subsystem_facade,verb);
    EventHandler::setVerbosity(this_00,subsystem_load,verb);
    EventHandler::setVerbosity(this_00,subsystem_prepare,verb);
    EventHandler::setVerbosity(this_00,subsystem_solve,verb);
    uVar4 = (this->clasp_).ptr_ & 0xfffffffffffffffe;
    uVar3 = (this->logger_).ptr_;
    *(EventHandler **)(uVar4 + 0x108) = this_00;
    *(uint *)(uVar4 + 0x118) = *(uint *)(uVar4 + 0x118) & 0x3fffffff | (uint)(1 < uVar3) << 0x1e;
  }
  return;
}

Assistant:

void ClaspAppBase::setup() {
	ProblemType pt = getProblemType();
	clasp_         = new ClaspFacade();
	if (setFpuMode()) { fpuMode_ = fpuInit(); }
	if (!claspAppOpts_.onlyPre) {
		out_ = createOutput(pt);
		Event::Verbosity verb	= (Event::Verbosity)std::min(verbose(), (uint32)Event::verbosity_max);
		if (out_.get() && out_->verbosity() < (uint32)verb) { verb = (Event::Verbosity)out_->verbosity(); }
		if (!claspAppOpts_.lemmaLog.empty()) {
			logger_ = new LemmaLogger(claspAppOpts_.lemmaLog.c_str(), claspAppOpts_.lemma);
		}
		EventHandler::setVerbosity(Event::subsystem_facade , verb);
		EventHandler::setVerbosity(Event::subsystem_load   , verb);
		EventHandler::setVerbosity(Event::subsystem_prepare, verb);
		EventHandler::setVerbosity(Event::subsystem_solve  , verb);
		clasp_->ctx.setEventHandler(this, logger_.get() == 0 ? SharedContext::report_default : SharedContext::report_conflict);
	}
}